

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgFirstPermutation(Abc_TgMan_t *pMan)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < (long)pMan->nGVars) {
    memset(pMan->pPermDir,0xff,(long)pMan->nGVars);
  }
  if (0 < (long)pMan->nGroups) {
    lVar2 = 0;
    do {
      lVar3 = (long)pMan->pGroup[lVar2].iStart;
      if (pMan->pPermDir[lVar3] != -1) {
LAB_004fc741:
        __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x89f,"void Abc_TgFirstPermutation(Abc_TgMan_t *)");
      }
      cVar1 = pMan->pGroup[lVar2].nGVars;
      if ('\x01' < cVar1) {
        lVar4 = 0;
        do {
          if ((pMan->pPermDir[lVar4 + lVar3 + 1] != -1) ||
             (pMan->pPerm[lVar4 + lVar3 + 1] < pMan->pPerm[lVar4 + lVar3])) goto LAB_004fc741;
          lVar4 = lVar4 + 1;
        } while ((long)cVar1 + -1 != lVar4);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != pMan->nGroups);
  }
  return;
}

Assistant:

static void Abc_TgFirstPermutation(Abc_TgMan_t * pMan)
{
    int i;
    for (i = 0; i < pMan->nGVars; i++)
        pMan->pPermDir[i] = -1;
#ifndef NDEBUG
    for (i = 0; i < pMan->nGroups; i++)
    {
        TiedGroup * pGrp = pMan->pGroup + i;
        int nGvars = pGrp->nGVars;
        char * pVars = pMan->pPerm + pGrp->iStart;
        signed char * pDirs = pMan->pPermDir + pGrp->iStart;
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
#endif
}